

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

void anon_unknown.dwarf_24c6d0e::addFileSetEntry
               (cmGeneratorTarget *headTarget,string *config,
               cmGeneratorExpressionDAGChecker *dagChecker,cmFileSet *fileSet,
               EvaluatedTargetPropertyEntries *entries)

{
  pointer pcVar1;
  pointer pcVar2;
  cmMakefile *this;
  size_type sVar3;
  EvaluatedTargetPropertyEntries *pEVar4;
  int iVar5;
  cmSourceFile *this_00;
  string *psVar6;
  cmSourceGroup *pcVar7;
  undefined1 uVar8;
  string *sourceName;
  cmSourceGroup *sg;
  pointer this_01;
  pointer puVar9;
  bool bVar10;
  cmFileSet *pcVar11;
  string w;
  string e;
  string path;
  TargetPropertyEntryFileSet tpe;
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  dirCges;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dirs;
  string local_1c8;
  cmGeneratorTarget *local_1a8;
  cmFileSet *local_1a0;
  pointer local_198;
  __uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  local_190;
  undefined1 local_188 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_170;
  cmake *local_150;
  string local_148;
  string local_128;
  TargetPropertyEntry local_108;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f8;
  undefined1 local_e0;
  _Head_base<0UL,_cmCompiledGeneratorExpression_*,_false> local_d8;
  cmFileSet *local_d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  EvaluatedTargetPropertyEntries *local_a8;
  pointer local_a0;
  string *local_98;
  cmGeneratorExpressionDAGChecker *local_90;
  pointer local_88;
  string *local_80;
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  local_78;
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  cmFileSet::CompileDirectoryEntries(&local_60,fileSet);
  local_1a8 = headTarget;
  local_1a0 = fileSet;
  local_98 = config;
  local_90 = dagChecker;
  cmFileSet::EvaluateDirectoryEntries
            (&local_48,fileSet,&local_60,headTarget->LocalGenerator,config,headTarget,dagChecker);
  if (local_60.
      super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_60.
      super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    uVar8 = 0;
  }
  else {
    uVar8 = 0;
    do {
      puVar9 = local_60.
               super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 1;
      if ((((local_60.
             super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_t).
           super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
           .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl)->
          HadContextSensitiveCondition != false) {
        uVar8 = 1;
        break;
      }
      local_60.
      super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = puVar9;
    } while (puVar9 != local_60.
                       super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_150 = cmLocalGenerator::GetCMakeInstance(local_1a8->LocalGenerator);
  cmFileSet::CompileFileEntries(&local_78,local_1a0);
  local_a0 = local_78.
             super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  puVar9 = local_78.
           super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pEVar4 = entries;
  if (local_78.
      super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_78.
      super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      local_a8 = pEVar4;
      pEVar4 = local_a8;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_c8,&local_48);
      local_d8._M_head_impl =
           (puVar9->_M_t).
           super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
           .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl;
      (puVar9->_M_t).
      super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
      .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl =
           (cmCompiledGeneratorExpression *)0x0;
      local_108.LinkImplItem = &cmGeneratorTarget::TargetPropertyEntry::NoLinkImplItem;
      local_108._vptr_TargetPropertyEntry = (_func_int **)&PTR__TargetPropertyEntryFileSet_00b45658;
      local_f8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_c8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_f8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_c8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_f8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_c8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_190._M_t.
      super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
      .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl =
           (tuple<cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
            )(_Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
              )0x0;
      local_d0 = local_1a0;
      local_e0 = uVar8;
      std::
      unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
      ::~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                     *)&local_190);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_c8);
      local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"");
      EvaluateTargetPropertyEntry
                ((EvaluatedTargetPropertyEntry *)local_188,local_1a8,local_98,&local_1c8,local_90,
                 &local_108);
      std::vector<EvaluatedTargetPropertyEntry,_std::allocator<EvaluatedTargetPropertyEntry>_>::
      emplace_back<EvaluatedTargetPropertyEntry>
                (&pEVar4->Entries,(EvaluatedTargetPropertyEntry *)local_188);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_170);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(local_188._17_7_,local_188[0x10])
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   CONCAT71(local_188._17_7_,local_188[0x10]));
      }
      local_88 = puVar9;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,
                        CONCAT71(local_1c8.field_2._M_allocated_capacity._1_7_,
                                 local_1c8.field_2._M_local_buf[0]) + 1);
      }
      local_198 = (pEVar4->Entries).
                  super__Vector_base<EvaluatedTargetPropertyEntry,_std::allocator<EvaluatedTargetPropertyEntry>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      sourceName = local_198[-1].Values.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
      local_80 = local_198[-1].Values.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      if (sourceName != local_80) {
        local_198 = (pointer)&local_198[-1].Backtrace;
        pcVar11 = local_1a0;
        do {
          this_00 = cmMakefile::GetOrCreateSource(local_1a8->Makefile,sourceName,false,Ambiguous);
          if (((pcVar11->Type)._M_string_length == 7) &&
             (iVar5 = bcmp((pcVar11->Type)._M_dataplus._M_p,"HEADERS",7), iVar5 == 0)) {
            local_188._0_8_ = local_188 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_188,"HEADER_FILE_ONLY","");
            local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"TRUE","");
            cmSourceFile::SetProperty(this_00,(string *)local_188,&local_1c8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
              operator_delete(local_1c8._M_dataplus._M_p,
                              CONCAT71(local_1c8.field_2._M_allocated_capacity._1_7_,
                                       local_1c8.field_2._M_local_buf[0]) + 1);
            }
            if ((cmLinkImplItem *)local_188._0_8_ != (cmLinkImplItem *)(local_188 + 0x10)) {
              operator_delete((void *)local_188._0_8_,CONCAT71(local_188._17_7_,local_188[0x10]) + 1
                             );
            }
          }
          local_188._0_8_ = local_188 + 0x10;
          local_188._8_8_ = (element_type *)0x0;
          local_188[0x10] = '\0';
          local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
          local_1c8._M_string_length = 0;
          local_1c8.field_2._M_local_buf[0] = '\0';
          psVar6 = cmSourceFile::ResolveFullPath(this_00,(string *)local_188,&local_1c8);
          local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
          pcVar1 = (psVar6->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_148,pcVar1,pcVar1 + psVar6->_M_string_length);
          if (local_1c8._M_string_length != 0) {
            cmake::IssueMessage(local_150,AUTHOR_WARNING,&local_1c8,(cmListFileBacktrace *)local_198
                               );
          }
          sVar3 = local_148._M_string_length;
          if (local_148._M_string_length == 0) {
            if ((element_type *)local_188._8_8_ != (element_type *)0x0) {
              cmake::IssueMessage(local_150,FATAL_ERROR,(string *)local_188,
                                  (cmListFileBacktrace *)local_198);
            }
          }
          else {
            this_01 = (local_1a8->Makefile->SourceGroups).
                      super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pcVar2 = (local_1a8->Makefile->SourceGroups).
                     super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            if (this_01 != pcVar2) {
              bVar10 = false;
              do {
                pcVar7 = cmSourceGroup::MatchChildrenFiles(this_01,&local_148);
                if (pcVar7 != (cmSourceGroup *)0x0) {
                  bVar10 = true;
                  break;
                }
                this_01 = this_01 + 1;
              } while (this_01 != pcVar2);
              pcVar11 = local_1a0;
              if (bVar10) goto LAB_005acae0;
            }
            if (((pcVar11->Type)._M_string_length == 7) &&
               (iVar5 = bcmp((pcVar11->Type)._M_dataplus._M_p,"HEADERS",7), iVar5 == 0)) {
              this = local_1a8->Makefile;
              local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_128,"Header Files","");
              pcVar7 = cmMakefile::GetOrCreateSourceGroup(this,&local_128);
              cmSourceGroup::AddGroupFile(pcVar7,&local_148);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_128._M_dataplus._M_p != &local_128.field_2) {
                operator_delete(local_128._M_dataplus._M_p,
                                local_128.field_2._M_allocated_capacity + 1);
              }
            }
          }
LAB_005acae0:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p != &local_148.field_2) {
            operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
            operator_delete(local_1c8._M_dataplus._M_p,
                            CONCAT71(local_1c8.field_2._M_allocated_capacity._1_7_,
                                     local_1c8.field_2._M_local_buf[0]) + 1);
          }
          if ((cmLinkImplItem *)local_188._0_8_ != (cmLinkImplItem *)(local_188 + 0x10)) {
            operator_delete((void *)local_188._0_8_,CONCAT71(local_188._17_7_,local_188[0x10]) + 1);
          }
          if (sVar3 == 0) {
            local_108._vptr_TargetPropertyEntry =
                 (_func_int **)&PTR__TargetPropertyEntryFileSet_00b45658;
            std::
            unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
            ::~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                           *)&local_d8);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_f8);
            goto LAB_005acbd7;
          }
          sourceName = sourceName + 1;
        } while (sourceName != local_80);
      }
      local_108._vptr_TargetPropertyEntry = (_func_int **)&PTR__TargetPropertyEntryFileSet_00b45658;
      std::
      unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
      ::~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                     *)&local_d8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_f8);
      puVar9 = local_88 + 1;
      pEVar4 = local_a8;
    } while (local_88 + 1 != local_a0);
  }
LAB_005acbd7:
  std::
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  ::~vector(&local_78);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  std::
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  ::~vector(&local_60);
  return;
}

Assistant:

void addFileSetEntry(cmGeneratorTarget const* headTarget,
                     std::string const& config,
                     cmGeneratorExpressionDAGChecker* dagChecker,
                     cmFileSet const* fileSet,
                     EvaluatedTargetPropertyEntries& entries)
{
  auto dirCges = fileSet->CompileDirectoryEntries();
  auto dirs = fileSet->EvaluateDirectoryEntries(
    dirCges, headTarget->GetLocalGenerator(), config, headTarget, dagChecker);
  bool contextSensitiveDirs = false;
  for (auto const& dirCge : dirCges) {
    if (dirCge->GetHadContextSensitiveCondition()) {
      contextSensitiveDirs = true;
      break;
    }
  }
  cmake* cm = headTarget->GetLocalGenerator()->GetCMakeInstance();
  for (auto& entryCge : fileSet->CompileFileEntries()) {
    TargetPropertyEntryFileSet tpe(dirs, contextSensitiveDirs,
                                   std::move(entryCge), fileSet);
    entries.Entries.emplace_back(
      EvaluateTargetPropertyEntry(headTarget, config, "", dagChecker, tpe));
    EvaluatedTargetPropertyEntry const& entry = entries.Entries.back();
    for (auto const& file : entry.Values) {
      auto* sf = headTarget->Makefile->GetOrCreateSource(file);
      if (fileSet->GetType() == "HEADERS"_s) {
        sf->SetProperty("HEADER_FILE_ONLY", "TRUE");
      }

#ifndef CMAKE_BOOTSTRAP
      std::string e;
      std::string w;
      auto path = sf->ResolveFullPath(&e, &w);
      if (!w.empty()) {
        cm->IssueMessage(MessageType::AUTHOR_WARNING, w, entry.Backtrace);
      }
      if (path.empty()) {
        if (!e.empty()) {
          cm->IssueMessage(MessageType::FATAL_ERROR, e, entry.Backtrace);
        }
        return;
      }
      bool found = false;
      for (auto const& sg : headTarget->Makefile->GetSourceGroups()) {
        if (sg.MatchChildrenFiles(path)) {
          found = true;
          break;
        }
      }
      if (!found) {
        if (fileSet->GetType() == "HEADERS"_s) {
          headTarget->Makefile->GetOrCreateSourceGroup("Header Files")
            ->AddGroupFile(path);
        }
      }
#endif
    }
  }
}